

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O0

bool __thiscall
GmmLib::GmmTextureCalc::GetRedescribedPlaneParams
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_YUV_PLANE PlaneType,
          GMM_TEXTURE_INFO *pRedescribedTexInfo)

{
  uint32_t uVar1;
  bool bVar2;
  uint8_t uVar3;
  undefined1 uVar4;
  uint uVar5;
  GMM_GFX_SIZE_T GVar6;
  long in_FS_OFFSET;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_STATUS Status;
  GMM_TEXTURE_INFO *pRedescribedTexInfo_local;
  GMM_YUV_PLANE PlaneType_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  GMM_TEXTURE_INFO TexInfoUVPlane;
  
  TexInfoUVPlane._512_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  GmmGetPlatformInfo(this->pGmmLibContext);
  memcpy(pRedescribedTexInfo,pTexInfo,0x208);
  (pRedescribedTexInfo->Flags).Info =
       (anon_struct_8_44_94931171_for_Info)
       ((ulong)(pRedescribedTexInfo->Flags).Info & 0xffffffffefffffff);
  memcpy(&this_local,pTexInfo,0x208);
  uVar3 = GmmIsUVPacked(pTexInfo->Format);
  if (uVar3 == '\0') {
    if ((PlaneType == GMM_PLANE_3D_UV0) || (PlaneType == GMM_PLANE_3D_UV1)) {
      uVar5 = pTexInfo->Format - GMM_FORMAT_IMC1;
      if (uVar5 < 9 || pTexInfo->Format == GMM_FORMAT_MFX_JPEG_YUV422V) {
        uVar4 = (*(code *)(&DAT_002b4d0c + *(int *)(&DAT_002b4d0c + (ulong)uVar5 * 4)))();
        return (bool)uVar4;
      }
      bVar2 = true;
      goto LAB_0028dfc7;
    }
  }
  else if ((PlaneType == GMM_PLANE_3D_UV0) || (PlaneType == GMM_PLANE_3D_UV1)) {
    uVar5 = pTexInfo->Format - GMM_FORMAT_NV12;
    if (uVar5 < 0x23 || pTexInfo->Format == GMM_FORMAT_P216) {
      uVar4 = (*(code *)(&DAT_002b4d34 + *(int *)(&DAT_002b4d34 + (ulong)uVar5 * 4)))();
      return (bool)uVar4;
    }
    bVar2 = true;
    goto LAB_0028dfc7;
  }
  SetTileMode(this,pRedescribedTexInfo);
  uVar1 = pRedescribedTexInfo->BitsPerPixel;
  if (uVar1 == 8) {
    pRedescribedTexInfo->Format = GMM_FORMAT_R8_UINT;
  }
  else if (uVar1 == 0x10) {
    pRedescribedTexInfo->Format = GMM_FORMAT_R16_UINT;
  }
  else {
    if (uVar1 != 0x20) {
      bVar2 = true;
      goto LAB_0028dfc7;
    }
    pRedescribedTexInfo->Format = GMM_FORMAT_R32_UINT;
  }
  if (pTexInfo->ArraySize < 2) {
    pRedescribedTexInfo->Size =
         (ulong)((pRedescribedTexInfo->BaseHeight + ((pTexInfo->Alignment).VAlign - 1)) -
                (pRedescribedTexInfo->BaseHeight + ((pTexInfo->Alignment).VAlign - 1) &
                (pTexInfo->Alignment).VAlign - 1)) * pTexInfo->Pitch;
  }
  else {
    (pRedescribedTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = 0;
    (pRedescribedTexInfo->Alignment).QPitch =
         (pRedescribedTexInfo->BaseHeight + ((pTexInfo->Alignment).VAlign - 1)) -
         (pRedescribedTexInfo->BaseHeight + ((pTexInfo->Alignment).VAlign - 1) &
         (pTexInfo->Alignment).VAlign - 1);
    GVar6 = (ulong)(pRedescribedTexInfo->Alignment).QPitch * pTexInfo->Pitch;
    (pRedescribedTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Mip0SlicePitch = GVar6;
    (pRedescribedTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0] = GVar6;
    pRedescribedTexInfo->Size =
         (ulong)(pRedescribedTexInfo->Alignment).QPitch * pTexInfo->Pitch *
         (ulong)pTexInfo->ArraySize;
  }
LAB_0028dfc7:
  if (*(long *)(in_FS_OFFSET + 0x28) != TexInfoUVPlane._512_8_) {
    __stack_chk_fail();
  }
  return (bool)(-!bVar2 & 1);
}

Assistant:

bool GmmLib::GmmTextureCalc::GetRedescribedPlaneParams(GMM_TEXTURE_INFO *pTexInfo, GMM_YUV_PLANE PlaneType, GMM_TEXTURE_INFO *pRedescribedTexInfo)
{
    GMM_STATUS               Status = GMM_SUCCESS;
    GMM_TEXTURE_INFO         TexInfoUVPlane;
    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    __GMM_ASSERT(pTexInfo);
    __GMM_ASSERT(pTexInfo->Flags.Info.RedecribedPlanes);
    __GMM_ASSERT(pRedescribedTexInfo);

    *pRedescribedTexInfo                             = *pTexInfo;
    pRedescribedTexInfo->Flags.Info.RedecribedPlanes = 0;
#ifdef _WIN32
    memcpy_s(&TexInfoUVPlane, sizeof(GMM_TEXTURE_INFO), pTexInfo, sizeof(GMM_TEXTURE_INFO));
#else
    memcpy(&TexInfoUVPlane, pTexInfo, sizeof(GMM_TEXTURE_INFO));
#endif // _WIN32

    if(GmmIsUVPacked(pTexInfo->Format))
    {
        // UV packed resources must have two seperate
        // tiling modes per plane, due to the packed
        // UV plane having twice the bits per pixel
        // as the Y plane.
        if((PlaneType == GMM_PLANE_U) || (PlaneType == GMM_PLANE_V))
        {
            switch(pTexInfo->Format)
            {
                // GMM_FORMAT_NV11  :                               linear format, no tiling supported, hence no redescription supported
                case GMM_FORMAT_NV12:
                case GMM_FORMAT_NV21:
                    pRedescribedTexInfo->BitsPerPixel = 16;
                    pRedescribedTexInfo->BaseWidth    = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    pRedescribedTexInfo->BaseHeight   = GFX_CEIL_DIV(pTexInfo->BaseHeight, 2);
                    break;
                case GMM_FORMAT_P208:
                    pRedescribedTexInfo->BitsPerPixel = 16;
                    pRedescribedTexInfo->BaseWidth    = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    // same base height as main surface
                    break;
                case GMM_FORMAT_P010:
                case GMM_FORMAT_P012:
                case GMM_FORMAT_P016:
                    pRedescribedTexInfo->BitsPerPixel = 32;
                    pRedescribedTexInfo->BaseWidth    = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    pRedescribedTexInfo->BaseHeight   = GFX_CEIL_DIV(pTexInfo->BaseHeight, 2);
                    break;
                case GMM_FORMAT_P216:
                    pRedescribedTexInfo->BitsPerPixel = 32;
                    pRedescribedTexInfo->BaseWidth    = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    // same base height as main surface
                    break;
                default:
                    GMM_ASSERTDPF(0, "Unsupported format/pixel size combo!");
                    Status = GMM_INVALIDPARAM;
                    goto ERROR_CASE;
                    break;
            }
        }
    }
    else
    {
        // Non-UV packed surfaces TileMode of each plane is same as that of pTexInfo
        if((PlaneType == GMM_PLANE_U) || (PlaneType == GMM_PLANE_V))
        { // Non-UV packed surfaces only require the plane descriptors have proper height and width for each plane
            switch(pTexInfo->Format)
            {
                case GMM_FORMAT_IMC1:
                case GMM_FORMAT_IMC2:
                case GMM_FORMAT_IMC3:
                case GMM_FORMAT_IMC4:
                case GMM_FORMAT_MFX_JPEG_YUV420:
                    pRedescribedTexInfo->BaseWidth  = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    pRedescribedTexInfo->BaseHeight = GFX_CEIL_DIV(pTexInfo->BaseHeight, 2);
                    break;
                case GMM_FORMAT_MFX_JPEG_YUV422V:
                    pRedescribedTexInfo->BaseHeight = GFX_CEIL_DIV(pTexInfo->BaseHeight, 2);
                    break;
                case GMM_FORMAT_MFX_JPEG_YUV411R_TYPE:
                    pRedescribedTexInfo->BaseHeight = GFX_CEIL_DIV(pTexInfo->BaseHeight, 4);
                    break;
                case GMM_FORMAT_MFX_JPEG_YUV411:
                    pRedescribedTexInfo->BaseWidth = GFX_CEIL_DIV(pTexInfo->BaseWidth, 4);
                    break;
                case GMM_FORMAT_MFX_JPEG_YUV422H:
                    pRedescribedTexInfo->BaseWidth = GFX_CEIL_DIV(pTexInfo->BaseWidth, 2);
                    break;
                default:
                    GMM_ASSERTDPF(0, "Unsupported format/pixel size combo!");
                    Status = GMM_INVALIDPARAM;
                    goto ERROR_CASE;
                    break;
            }
        }
    }

    SetTileMode(pRedescribedTexInfo);
    switch(pRedescribedTexInfo->BitsPerPixel)
    {
        case 8:
            pRedescribedTexInfo->Format = GMM_FORMAT_R8_UINT;
            break;
        case 16:
            pRedescribedTexInfo->Format = GMM_FORMAT_R16_UINT;
            break;
        case 32:
            pRedescribedTexInfo->Format = GMM_FORMAT_R32_UINT;
            break;
        default:
            GMM_ASSERTDPF(0, "Unsupported format/pixel size combo!");
            Status = GMM_INVALIDPARAM;
            goto ERROR_CASE;
            break;
    }
    if(pTexInfo->ArraySize > 1)
    {
        pRedescribedTexInfo->OffsetInfo.Plane.ArrayQPitch = 0; // no longer a planar format on redescription
        pRedescribedTexInfo->Alignment.QPitch             = GFX_ALIGN(pRedescribedTexInfo->BaseHeight, pTexInfo->Alignment.VAlign);
        pRedescribedTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchRender =
        pRedescribedTexInfo->OffsetInfo.Texture2DOffsetInfo.ArrayQPitchLock = pRedescribedTexInfo->Alignment.QPitch * pTexInfo->Pitch;
        pRedescribedTexInfo->Size                                           = pRedescribedTexInfo->Alignment.QPitch * pTexInfo->Pitch * pTexInfo->ArraySize;
    }
    else
    {
        pRedescribedTexInfo->Size = (GFX_ALIGN(pRedescribedTexInfo->BaseHeight, pTexInfo->Alignment.VAlign)) * pTexInfo->Pitch;
    }

ERROR_CASE:
    return (Status == GMM_SUCCESS) ? true : false;
}